

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Tag::Clear(Tag *this)

{
  int iVar1;
  
  iVar1 = this->simple_tags_count_;
  while (0 < iVar1) {
    this->simple_tags_count_ = iVar1 - 1U;
    SimpleTag::Clear(this->simple_tags_ + (iVar1 - 1U));
    iVar1 = this->simple_tags_count_;
  }
  if (this->simple_tags_ != (SimpleTag *)0x0) {
    operator_delete__(this->simple_tags_);
  }
  this->simple_tags_ = (SimpleTag *)0x0;
  this->simple_tags_size_ = 0;
  return;
}

Assistant:

void Tag::Clear() {
  while (simple_tags_count_ > 0) {
    SimpleTag& st = simple_tags_[--simple_tags_count_];
    st.Clear();
  }

  delete[] simple_tags_;
  simple_tags_ = NULL;

  simple_tags_size_ = 0;
}